

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::PicturedInputBufferHash(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  Cell CVar4;
  const_reference pvVar5;
  allocator<char> local_49;
  string local_48;
  
  requireDStackDepth(this,2,"#");
  this_00 = &this->dStack;
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar3 = ForthStack<unsigned_int>::getTop(this_00,0);
  CVar4 = getNumericBase(this);
  if (CVar4 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"#: zero numeric base",&local_49);
    throwCppExceptionMessage(this,&local_48,errorUnsupportedOperation);
  }
  else {
    if (CVar4 < 0x25) goto LAB_00111ba4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"#: numeric base > 36",&local_49);
    throwCppExceptionMessage(this,&local_48,errorUnsupportedOperation);
  }
  std::__cxx11::string::~string((string *)&local_48);
LAB_00111ba4:
  auVar1._8_8_ = 0;
  auVar1._0_8_ = CONCAT44(uVar3,uVar2);
  pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      digitsCodes_abi_cxx11_,CONCAT44(uVar3,uVar2) % (ulong)CVar4);
  local_48._M_dataplus._M_p._0_1_ = *pvVar5;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->picturedInputBuffer,(uchar *)&local_48);
  ForthStack<unsigned_int>::setTop(this_00,1,SUB164(auVar1 / ZEXT416(CVar4),0));
  ForthStack<unsigned_int>::setTop(this_00,0,SUB164(auVar1 / ZEXT416(CVar4),4));
  return;
}

Assistant:

void PicturedInputBufferHash(){
			REQUIRE_DSTACK_DEPTH(2, "#");
			DCell d1(dStack.getTop(1),dStack.getTop(0));
			DCell base( getNumericBase() );
			RUNTIME_ERROR_IF(base.data_.Dcells == 0, "#: zero numeric base", errorUnsupportedOperation);
			RUNTIME_ERROR_IF(base.data_.Dcells > 36, "#: numeric base > 36", errorUnsupportedOperation);
			picturedInputBuffer.push_back(static_cast<Char>(digitsCodes.at(d1.data_.Dcells % base.data_.Dcells)));
			DCell d2( d1.data_.Dcells / base.data_.Dcells );
			dStack.setTop(1, d2.data_.Cells.lo);
			dStack.setTop(0, d2.data_.Cells.hi);
		}